

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O1

void print_options(void)

{
  char *pcVar1;
  nh_menuitem_conflict *items;
  long *plVar2;
  nh_menuitem *_item_;
  wchar_t wVar3;
  long lVar4;
  wchar_t wVar5;
  ulong uVar6;
  wchar_t wVar7;
  nh_option_desc *pnVar8;
  char buf [256];
  char acStack_138 [264];
  
  items = (nh_menuitem_conflict *)malloc(0xa78);
  items->id = L'\0';
  items->role = MI_HEADING;
  items->accel = '\0';
  items->group_accel = '\0';
  items->selected = '\0';
  builtin_strncpy(items->caption,"Birth options:",0xf);
  plVar2 = (long *)nh_get_options(0);
  if (*plVar2 == 0) {
    uVar6 = 1;
    wVar3 = L'\n';
  }
  else {
    wVar3 = L'\n';
    uVar6 = 1;
    lVar4 = 0x216;
    do {
      plVar2 = plVar2 + 6;
      snprintf(acStack_138,0x100,"%s\t%s");
      if ((long)wVar3 <= (long)uVar6) {
        wVar3 = wVar3 * 2;
        items = (nh_menuitem_conflict *)realloc(items,(long)wVar3 * 0x10c);
      }
      pcVar1 = items->caption + lVar4 + -8;
      *(undefined8 *)(pcVar1 + -0x10a) = 0;
      *(undefined2 *)(pcVar1 + -2) = MI_TEXT >> 0x10;
      *pcVar1 = '\0';
      strcpy(pcVar1 + -0x102,acStack_138);
      uVar6 = uVar6 + 1;
      lVar4 = lVar4 + 0x10c;
    } while (*plVar2 != 0);
  }
  wVar5 = (wchar_t)uVar6;
  if (wVar3 <= wVar5) {
    wVar3 = wVar3 * 2;
    items = (nh_menuitem_conflict *)realloc(items,(long)wVar3 * 0x10c);
  }
  uVar6 = uVar6 & 0xffffffff;
  items[uVar6].accel = '\0';
  items[uVar6].group_accel = '\0';
  items[uVar6].selected = '\0';
  wVar7 = wVar5 + L'\x01';
  items[uVar6].caption[0] = '\0';
  items[uVar6].id = L'\0';
  items[uVar6].role = MI_TEXT;
  if (wVar3 <= wVar7) {
    wVar3 = wVar3 * 2;
    items = (nh_menuitem_conflict *)realloc(items,(long)wVar3 * 0x10c);
  }
  items[(uint)wVar7].id = L'\0';
  items[(uint)wVar7].role = MI_HEADING;
  items[(uint)wVar7].accel = '\0';
  items[(uint)wVar7].group_accel = '\0';
  items[(uint)wVar7].selected = '\0';
  builtin_strncpy(items[(uint)wVar7].caption,"Game opt",8);
  builtin_strncpy(items[(uint)wVar7].caption + 6,"ptions:",8);
  wVar5 = wVar5 + L'\x02';
  plVar2 = (long *)nh_get_options(2);
  if (*plVar2 != 0) {
    lVar4 = (ulong)(uint)wVar5 * 0x10c + 0x10a;
    do {
      plVar2 = plVar2 + 6;
      snprintf(acStack_138,0x100,"%s\t%s");
      if (wVar3 <= wVar5) {
        wVar3 = wVar3 * 2;
        items = (nh_menuitem_conflict *)realloc(items,(long)wVar3 * 0x10c);
      }
      pcVar1 = items->caption + lVar4 + -8;
      *(undefined8 *)(pcVar1 + -0x10a) = 0;
      *(undefined2 *)(pcVar1 + -2) = MI_TEXT >> 0x10;
      *pcVar1 = '\0';
      strcpy(pcVar1 + -0x102,acStack_138);
      wVar5 = wVar5 + L'\x01';
      lVar4 = lVar4 + 0x10c;
    } while (*plVar2 != 0);
  }
  if (wVar3 <= wVar5) {
    wVar3 = wVar3 * 2;
    items = (nh_menuitem_conflict *)realloc(items,(long)wVar3 * 0x10c);
  }
  items[(uint)wVar5].accel = '\0';
  items[(uint)wVar5].group_accel = '\0';
  items[(uint)wVar5].selected = '\0';
  wVar7 = wVar5 + L'\x01';
  items[(uint)wVar5].caption[0] = '\0';
  items[(uint)wVar5].id = L'\0';
  items[(uint)wVar5].role = MI_TEXT;
  if (wVar3 <= wVar7) {
    wVar3 = wVar3 * 2;
    items = (nh_menuitem_conflict *)realloc(items,(long)wVar3 * 0x10c);
  }
  items[(uint)wVar7].id = L'\0';
  items[(uint)wVar7].role = MI_HEADING;
  items[(uint)wVar7].accel = '\0';
  items[(uint)wVar7].group_accel = '\0';
  items[(uint)wVar7].selected = '\0';
  builtin_strncpy(items[(uint)wVar7].caption,"Interface option",0x10);
  builtin_strncpy(items[(uint)wVar7].caption + 0xf,"ns:",4);
  wVar5 = wVar5 + L'\x02';
  if (curses_options[0].name != (char *)0x0) {
    lVar4 = (ulong)(uint)wVar5 * 0x10c + 0x10a;
    pnVar8 = curses_options;
    do {
      pnVar8 = pnVar8 + 1;
      snprintf(acStack_138,0x100,"%s\t%s");
      if (wVar3 <= wVar5) {
        wVar3 = wVar3 * 2;
        items = (nh_menuitem_conflict *)realloc(items,(long)wVar3 * 0x10c);
      }
      pcVar1 = items->caption + lVar4 + -8;
      *(undefined8 *)(pcVar1 + -0x10a) = 0;
      *(undefined2 *)(pcVar1 + -2) = MI_TEXT >> 0x10;
      *pcVar1 = '\0';
      strcpy(pcVar1 + -0x102,acStack_138);
      wVar5 = wVar5 + L'\x01';
      lVar4 = lVar4 + 0x10c;
    } while (pnVar8->name != (char *)0x0);
  }
  curses_display_menu(items,wVar5,"Available options:",L'\0',(wchar_t *)0x0);
  free(items);
  return;
}

Assistant:

void print_options(void)
{
    struct nh_menuitem *items;
    int i, icount, size;
    char buf[BUFSZ];
    struct nh_option_desc *options;

    icount = 0; size = 10;
    items = malloc(sizeof(struct nh_menuitem) * size);
    
    add_menu_txt(items, size, icount, "Birth options:", MI_HEADING);
    options = nh_get_options(CURRENT_BIRTH_OPTIONS);
    for (i = 0; options[i].name; i++) {
	snprintf(buf, BUFSZ, "%s\t%s", options[i].name, options[i].helptxt);
	add_menu_txt(items, size, icount, buf, MI_TEXT);
    }
    add_menu_txt(items, size, icount, "", MI_TEXT);
    
    add_menu_txt(items, size, icount, "Game options:", MI_HEADING);
    options = nh_get_options(GAME_OPTIONS);
    for (i = 0; options[i].name; i++) {
	snprintf(buf, BUFSZ, "%s\t%s", options[i].name, options[i].helptxt);
	add_menu_txt(items, size, icount, buf, MI_TEXT);
    }
    add_menu_txt(items, size, icount, "", MI_TEXT);

    /* add UI specific options */
    add_menu_txt(items, size, icount, "Interface options:", MI_HEADING);
    for (i = 0; curses_options[i].name; i++) {
	snprintf(buf, BUFSZ, "%s\t%s", curses_options[i].name, curses_options[i].helptxt);
	add_menu_txt(items, size, icount, buf, MI_TEXT);
    }

    curses_display_menu(items, icount, "Available options:", PICK_NONE, NULL);
    free(items);
}